

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_strref_snew(jit_State *J)

{
  undefined2 uVar1;
  uint32_t uVar2;
  TRef TVar3;
  jit_State *J_00;
  long in_RDI;
  IRRef1 str;
  IRIns *ir;
  uint local_14;
  
  if ((*(byte *)(in_RDI + 0xac) & 0x40) == 0) {
    if ((*(ushort *)(in_RDI + 0xa2) < 0x8000) && (*(int *)(in_RDI + 0xb8) == 0)) {
      local_14 = (uint)*(ushort *)(in_RDI + 0xa8);
    }
    else {
      J_00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)*(ushort *)(in_RDI + 0xa8) * 8);
      if ((J_00->cur).gct == '?') {
        uVar2 = (J_00->cur).nextgc.gcptr32;
        if (((J_00->cur).marked & 0x40) == 0) {
          uVar1 = *(undefined2 *)((long)&(J_00->cur).nextgc.gcptr32 + 2);
          *(undefined2 *)(in_RDI + 0xa4) = 0x2913;
          *(undefined2 *)(in_RDI + 0xa0) = uVar1;
          *(undefined2 *)(in_RDI + 0xa2) = *(undefined2 *)(in_RDI + 0xa2);
          TVar3 = lj_opt_fold(J_00);
          *(short *)(in_RDI + 0xa2) = (short)TVar3;
          *(short *)(in_RDI + 0xa0) = (short)uVar2;
          *(undefined2 *)(in_RDI + 0xa4) = 0x3f05;
          local_14 = 1;
        }
        else {
          local_14 = 0;
        }
      }
      else {
        local_14 = 0;
      }
    }
  }
  else {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

LJFOLD(STRREF SNEW any)
LJFOLDF(kfold_strref_snew)
{
  PHIBARRIER(fleft);
  if (irref_isk(fins->op2) && fright->i == 0) {
    return fleft->op1;  /* strref(snew(ptr, len), 0) ==> ptr */
  } else {
    /* Reassociate: strref(snew(strref(str, a), len), b) ==> strref(str, a+b) */
    IRIns *ir = IR(fleft->op1);
    if (ir->o == IR_STRREF) {
      IRRef1 str = ir->op1;  /* IRIns * is not valid across emitir. */
      PHIBARRIER(ir);
      fins->op2 = emitir(IRTI(IR_ADD), ir->op2, fins->op2); /* Clobbers fins! */
      fins->op1 = str;
      fins->ot = IRT(IR_STRREF, IRT_PGC);
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}